

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall jsonnet::internal::StripComments::fodder(StripComments *this,Fodder *fodder)

{
  pointer pFVar1;
  pointer pFVar2;
  Fodder *__range2;
  pointer pFVar3;
  FodderElement *f;
  value_type *__x;
  Fodder copy;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_38;
  
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&local_38,fodder);
  pFVar1 = (fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pFVar3 = pFVar1;
  __x = local_38.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar2 != pFVar1) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pFVar3->comment);
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != pFVar2);
    (fodder->
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    )._M_impl.super__Vector_impl_data._M_finish = pFVar1;
    __x = local_38.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; __x != local_38.
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    if (__x->kind == LINE_END) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      push_back(fodder,__x);
    }
  }
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(&local_38);
  return;
}

Assistant:

void fodder(Fodder &fodder)
    {
        Fodder copy = fodder;
        fodder.clear();
        for (auto &f : copy) {
            if (f.kind == FodderElement::LINE_END)
                fodder.push_back(f);
        }
    }